

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O3

Matrix<double,_4,_2> * __thiscall
gl4cts::Math::outerProduct<2,4>
          (Matrix<double,_4,_2> *__return_storage_ptr__,Math *this,Vector<double,_4> *left,
          Vector<double,_2> *right)

{
  double *pdVar1;
  double dVar2;
  long lVar3;
  double adStack_88 [2];
  Matrix<double,_1,_2> local_78;
  double local_68 [8];
  Matrix<double,_4,_1> local_28;
  
  (__return_storage_ptr__->m_data).m_data[0].m_data[0] = 1.0;
  (__return_storage_ptr__->m_data).m_data[0].m_data[1] = 0.0;
  *(undefined4 *)(__return_storage_ptr__->m_data).m_data[1].m_data = 0;
  *(undefined4 *)((long)(__return_storage_ptr__->m_data).m_data[1].m_data + 4) = 0;
  *(undefined4 *)((__return_storage_ptr__->m_data).m_data[1].m_data + 1) = 0;
  *(undefined4 *)((long)(__return_storage_ptr__->m_data).m_data[1].m_data + 0xc) = 0x3ff00000;
  (__return_storage_ptr__->m_data).m_data[0].m_data[2] = 0.0;
  (__return_storage_ptr__->m_data).m_data[0].m_data[3] = 0.0;
  (__return_storage_ptr__->m_data).m_data[1].m_data[2] = 0.0;
  (__return_storage_ptr__->m_data).m_data[1].m_data[3] = 0.0;
  local_28.m_data.m_data[0].m_data[0] = *(double *)this;
  local_28.m_data.m_data[0].m_data[1] = *(double *)(this + 8);
  local_28.m_data.m_data[0].m_data[2] = *(double *)(this + 0x10);
  local_28.m_data.m_data[0].m_data[3] = *(double *)(this + 0x18);
  local_78.m_data.m_data[0].m_data[0] = (double  [1])left->m_data[0];
  local_78.m_data.m_data[1].m_data[0] = (double  [1])left->m_data[1];
  adStack_88[1] = 4.79305088825787e-317;
  tcu::operator*(&local_28,&local_78);
  lVar3 = 4;
  do {
    dVar2 = adStack_88[lVar3 + 1];
    pdVar1 = (double *)((long)((__return_storage_ptr__->m_data).m_data + -1) + lVar3 * 8);
    *pdVar1 = adStack_88[lVar3];
    pdVar1[1] = dVar2;
    dVar2 = local_68[lVar3 + 1];
    pdVar1 = (__return_storage_ptr__->m_data).m_data[0].m_data + lVar3;
    *pdVar1 = local_68[lVar3];
    pdVar1[1] = dVar2;
    lVar3 = lVar3 + 2;
  } while (lVar3 != 8);
  return __return_storage_ptr__;
}

Assistant:

static tcu::Matrix<glw::GLdouble, Rows, Cols> outerProduct(const tcu::Vector<glw::GLdouble, Rows>& left,
														   const tcu::Vector<glw::GLdouble, Cols>& right)
{
	tcu::Matrix<glw::GLdouble, Rows, 1>	left_mat;
	tcu::Matrix<glw::GLdouble, 1, Cols>	right_mat;
	tcu::Matrix<glw::GLdouble, Rows, Cols> result;

	for (glw::GLuint i = 0; i < Rows; ++i)
	{
		left_mat(i, 0) = left[i];
	}

	for (glw::GLuint i = 0; i < Cols; ++i)
	{
		right_mat(0, i) = right[i];
	}

	result = left_mat * right_mat;

	return result;
}